

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O2

ctmbstr prvTidytidyErrorCodeAsKey(uint code)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar1 = 0;
  do {
    uVar2 = (ulong)uVar1;
    if (tidyStringsKeys[uVar2].key == (ctmbstr)0x0) {
      return "UNDEFINED";
    }
    uVar3 = (ulong)uVar1;
    uVar1 = uVar1 + 1;
  } while (tidyStringsKeys[uVar3].value != code);
  return tidyStringsKeys[uVar2].key;
}

Assistant:

ctmbstr TY_(tidyErrorCodeAsKey)(uint code)
{
    uint i = 0;
    while (tidyStringsKeys[i].key) {
        if ( tidyStringsKeys[i].value == code )
            return tidyStringsKeys[i].key;
        i++;
    }
    return "UNDEFINED";
}